

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_connection.c
# Opt level: O0

apx_error_t process_new_require_port_data_file(apx_clientConnection_t *self,apx_file_t *file)

{
  rmf_fileInfo_t *self_00;
  char *name;
  apx_nodeInstance_tag *self_01;
  apx_nodeInstance_t *node_instance;
  char *base_name;
  apx_file_t *file_local;
  apx_clientConnection_t *self_local;
  
  if ((self != (apx_clientConnection_t *)0x0) && (file != (apx_file_t *)0x0)) {
    self_00 = apx_file_get_file_info(file);
    name = rmf_fileInfo_base_name(self_00);
    if (name == (char *)0x0) {
      self_local._4_4_ = 2;
    }
    else {
      if ((self->base).node_manager == (apx_nodeManager_t *)0x0) {
        __assert_fail("self->base.node_manager != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/client_connection.c"
                      ,0x152,
                      "apx_error_t process_new_require_port_data_file(apx_clientConnection_t *, apx_file_t *)"
                     );
      }
      self_01 = apx_nodeManager_find((self->base).node_manager,name);
      if (self_01 == (apx_nodeInstance_tag *)0x0) {
        free(name);
        self_local._4_4_ = 0;
      }
      else {
        free(name);
        self_local._4_4_ = apx_nodeInstance_remote_file_published_notification(self_01,file);
      }
    }
    return self_local._4_4_;
  }
  __assert_fail("(self != NULL) && (file != NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/client_connection.c"
                ,0x14e,
                "apx_error_t process_new_require_port_data_file(apx_clientConnection_t *, apx_file_t *)"
               );
}

Assistant:

static apx_error_t process_new_require_port_data_file(apx_clientConnection_t* self, apx_file_t* file)
{
   assert((self != NULL) && (file != NULL));
   char* base_name = rmf_fileInfo_base_name(apx_file_get_file_info(file));
   if (base_name != NULL)
   {
      assert(self->base.node_manager != NULL);
      apx_nodeInstance_t* node_instance = apx_nodeManager_find(self->base.node_manager, base_name);
      if (node_instance != NULL)
      {
         free(base_name);
         return apx_nodeInstance_remote_file_published_notification(node_instance, file);
      }
      else
      {
#if APX_DEBUG_ENABLE
         printf("Node not found: \"%s\"\n", base_name);
#endif
        free(base_name);
      }
   }
   else
   {
      return APX_MEM_ERROR;
   }
   return APX_NO_ERROR;
}